

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

AssertionResult __thiscall testing::AssertionResult::operator!(AssertionResult *this)

{
  scoped_ptr<testing::internal::String> in_RDX;
  String *extraout_RDX;
  byte *in_RSI;
  AssertionResult AVar1;
  
  this->success_ = (bool)(*in_RSI ^ 1);
  (this->message_).ptr_ = (String *)0x0;
  if (*(String **)(in_RSI + 8) != (String *)0x0) {
    operator<<(this,*(String **)(in_RSI + 8));
    in_RDX.ptr_ = extraout_RDX;
  }
  AVar1.message_.ptr_ = in_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult AssertionResult::operator!() const {
  AssertionResult negation(!success_);
  if (message_.get() != NULL)
    negation << *message_;
  return negation;
}